

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

int protocol_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *pcVar1;
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar2;
  curl_socket_t cVar3;
  
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    iVar2 = 0;
  }
  else {
    UNRECOVERED_JUMPTABLE = pcVar1->handler->proto_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar2 = (*UNRECOVERED_JUMPTABLE)(data,pcVar1,socks);
      return iVar2;
    }
    iVar2 = 0;
    cVar3 = Curl_conn_get_socket(data,0);
    if (cVar3 != -1) {
      *socks = cVar3;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int protocol_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd;

  if(!conn)
    return GETSOCK_BLANK;
  if(conn->handler->proto_getsock)
    return conn->handler->proto_getsock(data, conn, socks);
  sockfd = Curl_conn_get_socket(data, FIRSTSOCKET);
  if(sockfd != CURL_SOCKET_BAD) {
    /* Default is to wait to something from the server */
    socks[0] = sockfd;
    return GETSOCK_READSOCK(0);
  }
  return GETSOCK_BLANK;
}